

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

int luaO_str2d(char *s,size_t len,lua_Number *result)

{
  bool bVar1;
  char *pcVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  undefined7 uVar11;
  int iVar12;
  double dVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int local_4c;
  byte *local_48;
  byte *local_40;
  undefined4 local_38;
  int local_34;
  
  pcVar2 = strpbrk(s,"nN");
  uVar8 = 0;
  if (pcVar2 != (char *)0x0) {
    return 0;
  }
  pcVar10 = "xX";
  pcVar2 = strpbrk(s,"xX");
  if (pcVar2 == (char *)0x0) {
    dVar13 = strtod(s,(char **)&local_40);
    uVar14 = SUB84(dVar13,0);
    uVar15 = (undefined4)((ulong)dVar13 >> 0x20);
    pbVar3 = local_40;
    goto LAB_0010ba9d;
  }
  local_34 = 0;
  local_4c = 0;
  pbVar3 = (byte *)s;
  do {
    local_48 = pbVar3;
    bVar5 = *local_48;
    pbVar3 = local_48 + 1;
  } while ((""[(ulong)bVar5 + 1] & 8) != 0);
  uVar11 = (undefined7)((ulong)pcVar10 >> 8);
  if (bVar5 == 0x2b) {
    local_38 = (undefined4)CONCAT71(uVar11,1);
LAB_0010b9e9:
    bVar5 = *pbVar3;
    local_48 = pbVar3;
  }
  else {
    if (bVar5 == 0x2d) {
      local_38 = 0;
      goto LAB_0010b9e9;
    }
    local_38 = (undefined4)CONCAT71(uVar11,1);
  }
  uVar14 = 0;
  uVar15 = 0;
  pbVar3 = (byte *)s;
  if ((bVar5 != 0x30) || ((local_48[1] | 0x20) != 0x78)) goto LAB_0010ba9d;
  local_48 = local_48 + 2;
  local_40 = (byte *)s;
  dVar13 = readhexa((char **)&local_48,0.0,&local_4c);
  iVar12 = 0;
  if (*local_48 == 0x2e) {
    local_48 = local_48 + 1;
    dVar13 = readhexa((char **)&local_48,dVar13,&local_34);
    iVar12 = local_34;
  }
  uVar14 = 0;
  uVar15 = 0;
  if (local_4c == 0 && iVar12 == 0) goto LAB_0010ba9d;
  iVar12 = iVar12 * -4;
  pbVar3 = local_48;
  if ((*local_48 | 0x20) == 0x70) {
    bVar5 = local_48[1];
    if (bVar5 == 0x2d) {
      bVar1 = false;
LAB_0010bae5:
      pbVar4 = local_48 + 2;
      bVar5 = local_48[2];
    }
    else {
      if (bVar5 == 0x2b) {
        bVar1 = true;
        goto LAB_0010bae5;
      }
      pbVar4 = local_48 + 1;
      bVar1 = true;
    }
    uVar7 = (ulong)bVar5;
    if ((""[uVar7 + 1] & 2) != 0) {
      iVar9 = 0;
      while ((""[uVar7 + 1] & 2) != 0) {
        iVar9 = iVar9 * 10 + (int)(char)uVar7 + -0x30;
        uVar7 = (ulong)pbVar4[1];
        pbVar4 = pbVar4 + 1;
      }
      iVar6 = -iVar9;
      if (bVar1) {
        iVar6 = iVar9;
      }
      iVar12 = iVar12 + iVar6;
      pbVar3 = pbVar4;
    }
  }
  if ((char)local_38 == '\0') {
    dVar13 = -dVar13;
  }
  local_40 = pbVar3;
  dVar13 = ldexp(dVar13,iVar12);
  uVar14 = SUB84(dVar13,0);
  uVar15 = (undefined4)((ulong)dVar13 >> 0x20);
LAB_0010ba9d:
  *result = (lua_Number)CONCAT44(uVar15,uVar14);
  if (pbVar3 != (byte *)s) {
    pbVar3 = pbVar3 + -1;
    do {
      pbVar4 = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
    } while ((""[(ulong)*pbVar4 + 1] & 8) != 0);
    uVar8 = (uint)(pbVar3 == (byte *)(s + len));
  }
  return uVar8;
}

Assistant:

int luaO_str2d (const char *s, size_t len, lua_Number *result) {
  char *endptr;
  if (strpbrk(s, "nN"))  /* reject 'inf' and 'nan' */
    return 0;
  else if (strpbrk(s, "xX"))  /* hexa? */
    *result = lua_strx2number(s, &endptr);
  else
    *result = lua_str2number(s, &endptr);
  if (endptr == s) return 0;  /* nothing recognized */
  while (lisspace(cast_uchar(*endptr))) endptr++;
  return (endptr == s + len);  /* OK if no trailing characters */
}